

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O2

void __thiscall Arena_Big_Test::TestBody(Arena_Big_Test *this)

{
  void *ptr;
  void *pvVar1;
  char *in_R9;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  Arena arena;
  string local_40;
  AssertionResult gtest_ar_;
  
  memt::Arena::Arena(&arena);
  ptr = memt::Arena::alloc(&arena,5);
  pvVar1 = memt::Arena::alloc(&arena,0x100000);
  memt::Arena::freeTop(&arena,pvVar1);
  pvVar1 = memt::Arena::alloc(&arena,0x100000);
  memt::Arena::freeTop(&arena,pvVar1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       arena._blocks._block._begin != arena._blocks._block._position ||
       arena._blocks._block._previous != (Block *)0x0;
  if (arena._blocks._block._begin == arena._blocks._block._position &&
      arena._blocks._block._previous == (Block *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"arena.isEmpty()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x27,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    memt::Arena::freeTop(&arena,ptr);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         arena._blocks._block._begin == arena._blocks._block._position &&
         arena._blocks._block._previous == (Block *)0x0;
    if (gtest_ar_.success_) goto LAB_0010c5fd;
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"arena.isEmpty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x29,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_68._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
LAB_0010c5fd:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  memt::Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, Big) {
  memt::Arena arena;
  void* a = arena.alloc(5);
  arena.freeTop(arena.alloc(1024 * 1024));
  arena.freeTop(arena.alloc(1024 * 1024));
  ASSERT_FALSE(arena.isEmpty());
  arena.freeTop(a);
  ASSERT_TRUE(arena.isEmpty());
}